

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEObserver.h
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall CEObserver::Time(CEObserver *this,CEDate *date)

{
  long *in_RDX;
  long in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar1;
  double dVar2;
  double utc;
  
  dVar1 = (double)(**(code **)(*in_RDX + 0x28))();
  dVar2 = floor(dVar1);
  dVar1 = *(double *)(in_RSI + 0xa8) / 24.0 + (dVar1 - dVar2);
  dVar2 = CppEphem::sec_per_day();
  CETime::TimeSec2Time((double *)(dVar2 * dVar1));
  CETime::TimeDbl2Vect((double *)this);
  return in_RDI;
}

Assistant:

inline
std::vector<double> CEObserver::Time(const CEDate& date)
{
    double utc = date.MJD();
    utc -= std::floor(utc);
    utc += utc_offset_/24.0;            // Do this here for precision reasons
    utc *= CppEphem::sec_per_day();
    return CETime::TimeDbl2Vect( CETime::TimeSec2Time(utc) ) ;
}